

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

void __thiscall
flatbuffers::ts::TsGenerator::TrackNsDef(TsGenerator *this,Definition *definition,string *type_name)

{
  IdlNamer *pIVar1;
  Namespace *pNVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
  *this_00;
  string path;
  string symbolic_name;
  string filepath;
  string def_mod_name;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  Namespace *local_b0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>>
  local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  size_t local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  filepath._M_dataplus._M_p = (pointer)&filepath.field_2;
  filepath._M_string_length = 0;
  symbolic_name._M_dataplus._M_p = (pointer)&symbolic_name.field_2;
  symbolic_name._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  filepath.field_2._M_local_buf[0] = '\0';
  symbolic_name.field_2._M_local_buf[0] = '\0';
  pNVar2 = definition->defined_namespace;
  pIVar1 = &this->namer_;
  if ((pNVar2->components).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pNVar2->components).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    (*(pIVar1->super_Namer)._vptr_Namer[0xc])(&def_mod_name,pIVar1,definition);
    std::__cxx11::string::_M_assign((string *)&symbolic_name);
    std::operator+(&local_50,(this->super_BaseGenerator).path_,&symbolic_name);
    std::operator+(&local_78.first,&local_50,".ts");
    std::__cxx11::string::operator=((string *)&filepath,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&def_mod_name);
  }
  else {
    (*(pIVar1->super_Namer)._vptr_Namer[0xd])(&def_mod_name,pIVar1,pNVar2,2,1);
    std::__cxx11::string::operator=((string *)&path,(string *)&def_mod_name);
    std::__cxx11::string::~string((string *)&def_mod_name);
    std::operator+(&def_mod_name,&path,".ts");
    std::__cxx11::string::operator=((string *)&filepath,(string *)&def_mod_name);
    std::__cxx11::string::~string((string *)&def_mod_name);
    (*(pIVar1->super_Namer)._vptr_Namer[0xd])
              (&def_mod_name,pIVar1,definition->defined_namespace,3,1);
    std::__cxx11::string::operator=((string *)&path,(string *)&def_mod_name);
    std::__cxx11::string::~string((string *)&def_mod_name);
    std::__cxx11::string::_M_assign((string *)&symbolic_name);
  }
  this_00 = &this->ns_defs_;
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
          ::count(this_00,&path);
  if (sVar3 == 0) {
    def_mod_name._M_dataplus._M_p = (pointer)&def_mod_name.field_2;
    def_mod_name._M_string_length = 0;
    def_mod_name.field_2._M_local_buf[0] = '\0';
    local_f0._M_p = (pointer)&local_e0;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_d0._M_allocated_capacity = (size_type)&local_c0;
    local_d0._8_8_ = 0;
    local_c0._M_local_buf[0] = '\0';
    local_a0.field_2._M_allocated_capacity = (size_type)&local_a0;
    local_a0._M_dataplus._M_p._0_4_ = _S_red;
    local_a0._M_string_length = 0;
    local_80 = 0;
    local_a0.field_2._8_8_ = local_a0.field_2._M_allocated_capacity;
    std::__cxx11::string::_M_assign((string *)&def_mod_name);
    std::__cxx11::string::_M_assign((string *)&local_f0);
    local_b0 = definition->defined_namespace;
    std::__cxx11::string::string((string *)&local_78,(string *)type_name);
    local_78.second = definition;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,flatbuffers::Definition_const*>>
              (local_a8,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::_M_assign((string *)local_d0._M_local_buf);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
             ::operator[](this_00,&path);
    anon_unknown_10::NsDefinition::operator=(pmVar4,(NsDefinition *)&def_mod_name);
    anon_unknown_10::NsDefinition::~NsDefinition((NsDefinition *)&def_mod_name);
  }
  else {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
             ::operator[](this_00,&path);
    std::__cxx11::string::string((string *)&def_mod_name,(string *)type_name);
    local_f0._M_p = (pointer)definition;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,flatbuffers::Definition_const*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>>
                *)&pmVar4->definitions,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>
                *)&def_mod_name);
    std::__cxx11::string::~string((string *)&def_mod_name);
  }
  std::__cxx11::string::~string((string *)&symbolic_name);
  std::__cxx11::string::~string((string *)&filepath);
  std::__cxx11::string::~string((string *)&path);
  return;
}

Assistant:

void TrackNsDef(const Definition &definition, std::string type_name) {
    std::string path;
    std::string filepath;
    std::string symbolic_name;
    if (definition.defined_namespace->components.size() > 0) {
      path = namer_.Directories(*definition.defined_namespace,
                                SkipDir::TrailingPathSeperator);
      filepath = path + ".ts";
      path = namer_.Directories(*definition.defined_namespace,
                                SkipDir::OutputPathAndTrailingPathSeparator);
      symbolic_name = definition.defined_namespace->components.back();
    } else {
      auto def_mod_name = namer_.File(definition, SkipFile::SuffixAndExtension);
      symbolic_name = file_name_;
      filepath = path_ + symbolic_name + ".ts";
    }
    if (ns_defs_.count(path) == 0) {
      NsDefinition nsDef;
      nsDef.path = path;
      nsDef.filepath = filepath;
      nsDef.ns = definition.defined_namespace;
      nsDef.definitions.insert(std::make_pair(type_name, &definition));
      nsDef.symbolic_name = symbolic_name;
      ns_defs_[path] = nsDef;
    } else {
      ns_defs_[path].definitions.insert(std::make_pair(type_name, &definition));
    }
  }